

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QAbstractButton ** __thiscall
QHash<QAbstractButton_*,_int>::keyImpl(QHash<QAbstractButton_*,_int> *this,int *value)

{
  Span *pSVar1;
  ulong uVar2;
  Data *pDVar3;
  ulong uVar4;
  
  pDVar3 = this->d;
  if (pDVar3 == (Data *)0x0) {
    return (QAbstractButton **)0x0;
  }
  if (pDVar3->spans->offsets[0] == 0xff) {
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      if (pDVar3->numBuckets == uVar4) {
        pDVar3 = (Data *)0x0;
        uVar4 = 0;
        break;
      }
      uVar2 = uVar4 + 1;
    } while (pDVar3->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    if (uVar4 == 0 && pDVar3 == (Data *)0x0) {
      return (QAbstractButton **)0x0;
    }
  }
  else {
    uVar4 = 0;
  }
  do {
    pSVar1 = pDVar3->spans;
    if (*(int *)(pSVar1[uVar4 >> 7].entries[pSVar1[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f]].storage.
                 data + 8) == *value) {
      return (QAbstractButton **)
             (pSVar1[uVar4 >> 7].entries + pSVar1[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f]);
    }
    do {
      if (pDVar3->numBuckets - 1 == uVar4) {
        uVar4 = 0;
        pDVar3 = (Data *)0x0;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (pSVar1[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    if ((uVar4 == 0) && (pDVar3 == (Data *)0x0)) {
      return (QAbstractButton **)0x0;
    }
  } while( true );
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }